

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void __thiscall
spirv_cross::SPIRAccessChain::SPIRAccessChain
          (SPIRAccessChain *this,TypeID basetype_,StorageClass storage_,string *base_,
          string *dynamic_index_,int32_t static_index_)

{
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRAccessChain_00354248;
  *(uint32_t *)&(this->super_IVariant).field_0xc = basetype_.id;
  this->storage = storage_;
  ::std::__cxx11::string::string((string *)&this->base,(string *)base_);
  ::std::__cxx11::string::string((string *)&this->dynamic_index,(string *)dynamic_index_);
  this->static_index = static_index_;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  this->loaded_from = 0;
  this->matrix_stride = 0;
  *(undefined8 *)((long)&this->matrix_stride + 2) = 0;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)&(this->implied_read_expressions).stack_storage;
  (this->implied_read_expressions).buffer_capacity = 8;
  return;
}

Assistant:

SPIRAccessChain(TypeID basetype_, spv::StorageClass storage_, std::string base_, std::string dynamic_index_,
	                int32_t static_index_)
	    : basetype(basetype_)
	    , storage(storage_)
	    , base(std::move(base_))
	    , dynamic_index(std::move(dynamic_index_))
	    , static_index(static_index_)
	{
	}